

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_ObjCutFilterBoth(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  uint uVar1;
  uint uVar2;
  Jf_Cut_t *pJVar3;
  Jf_Cut_t *pJVar4;
  int nLits_1;
  uint uVar5;
  int nLits;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  if (0 < c) {
    pJVar3 = pSto[(uint)c];
    uVar7 = pJVar3->pCut[0];
    uVar6 = uVar7 & 0xf;
    uVar8 = 0;
    do {
      pJVar4 = pSto[uVar8];
      uVar1 = pJVar4->pCut[0];
      if (((int)uVar1 <= (int)uVar7) && ((pJVar4->Sign & ~pJVar3->Sign) == 0)) {
        if ((uVar1 & 0xf) == 0) {
LAB_006ff8a2:
          pJVar3->pCut[0] = -1;
          return c;
        }
        lVar9 = 1;
        do {
          if (pJVar4->pCut[lVar9] < 0) goto LAB_006ff8df;
          if (uVar6 == 0) {
            iVar10 = 1;
          }
          else {
            uVar11 = 0;
            do {
              if (pJVar3->pCut[uVar11 + 1] < 0) goto LAB_006ff8df;
              if ((uint)(pJVar3->pCut[uVar11 + 1] ^ pJVar4->pCut[lVar9]) < 2) {
                iVar10 = (int)uVar11 + 1;
                break;
              }
              uVar11 = uVar11 + 1;
              iVar10 = uVar6 + 1;
            } while (uVar6 != uVar11);
          }
          if ((int)uVar7 < iVar10) break;
          lVar9 = lVar9 + 1;
          if (lVar9 == ((ulong)uVar1 & 0xf) + 1) goto LAB_006ff8a2;
        } while( true );
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)c);
  }
  if (c < 1) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
    do {
      pJVar3 = pSto[(uint)c];
      uVar1 = pJVar3->pCut[0];
      pJVar4 = pSto[uVar8];
      uVar2 = pJVar4->pCut[0];
      if (((int)uVar1 < (int)uVar2) && ((pJVar3->Sign & ~pJVar4->Sign) == 0)) {
        uVar7 = uVar6;
        if ((uVar1 & 0xf) != 0) {
          uVar5 = uVar2 & 0xf;
          lVar9 = 1;
          do {
            if (pJVar3->pCut[lVar9] < 0) {
LAB_006ff8df:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            if (uVar5 == 0) {
              iVar10 = 1;
            }
            else {
              uVar11 = 0;
              do {
                if (pJVar4->pCut[uVar11 + 1] < 0) goto LAB_006ff8df;
                if ((uint)(pJVar4->pCut[uVar11 + 1] ^ pJVar3->pCut[lVar9]) < 2) {
                  iVar10 = (int)uVar11 + 1;
                  break;
                }
                uVar11 = uVar11 + 1;
                iVar10 = uVar5 + 1;
              } while (uVar5 != uVar11);
            }
            if ((int)uVar2 < iVar10) goto LAB_006ff876;
            lVar9 = lVar9 + 1;
          } while (lVar9 != ((ulong)uVar1 & 0xf) + 1);
        }
      }
      else {
LAB_006ff876:
        uVar7 = uVar6 + 1;
        if (uVar8 != uVar6) {
          pJVar3 = pSto[(int)uVar6];
          pSto[(int)uVar6] = pJVar4;
          pSto[uVar8] = pJVar3;
        }
      }
      uVar8 = uVar8 + 1;
      uVar6 = uVar7;
    } while (uVar8 != (uint)c);
  }
  if ((int)uVar7 <= c) {
    if ((int)uVar7 < c) {
      pJVar3 = pSto[(int)uVar7];
      pSto[(int)uVar7] = pSto[c];
      pSto[c] = pJVar3;
    }
    return uVar7;
  }
  __assert_fail("last <= c",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                ,0x30e,"int Jf_ObjCutFilterBoth(Jf_Man_t *, Jf_Cut_t **, int)");
}

Assistant:

int Jf_ObjCutFilterBoth( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k, last;
    // filter this cut using other cuts
    for ( k = 0; k < c; k++ )
        if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
            (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
             Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
        {
                pSto[c]->pCut[0] = -1;
                return c;
        }
    // filter other cuts using this cut
    for ( k = last = 0; k < c; k++ )
        if ( !(pSto[c]->pCut[0] < pSto[k]->pCut[0] && 
              (pSto[c]->Sign & pSto[k]->Sign) == pSto[c]->Sign && 
               Jf_CutIsContained1(pSto[k]->pCut, pSto[c]->pCut)) )
        {
            if ( last++ == k )
                continue;
            ABC_SWAP( Jf_Cut_t *, pSto[last-1], pSto[k] );
        }
    assert( last <= c );
    if ( last < c )
        ABC_SWAP( Jf_Cut_t *, pSto[last], pSto[c] );
    return last;
}